

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O1

void Service_DeleteMonitoredItems
               (UA_Server *server,UA_Session *session,UA_DeleteMonitoredItemsRequest *request,
               UA_DeleteMonitoredItemsResponse *response)

{
  size_t sVar1;
  UA_StatusCode UVar2;
  UA_StatusCode *pUVar3;
  ulong uVar4;
  UA_Subscription *sub;
  
  sVar1 = request->monitoredItemIdsSize;
  if (sVar1 == 0) {
    UVar2 = 0x800f0000;
  }
  else {
    sub = (UA_Subscription *)&session->serverSubscriptions;
    UVar2 = 0x80280000;
    do {
      sub = (sub->listEntry).le_next;
      if (sub == (UA_Subscription *)0x0) goto LAB_00125f2b;
    } while (sub->subscriptionID != request->subscriptionId);
    if (sub != (UA_Subscription *)0x0) {
      sub->currentLifetimeCount = 0;
      pUVar3 = (UA_StatusCode *)malloc(sVar1 * 4);
      response->results = pUVar3;
      if (pUVar3 != (UA_StatusCode *)0x0) {
        response->resultsSize = sVar1;
        if (request->monitoredItemIdsSize == 0) {
          return;
        }
        uVar4 = 0;
        do {
          UVar2 = UA_Subscription_deleteMonitoredItem(server,sub,request->monitoredItemIds[uVar4]);
          response->results[uVar4] = UVar2;
          uVar4 = uVar4 + 1;
        } while (uVar4 < request->monitoredItemIdsSize);
        return;
      }
      UVar2 = 0x80030000;
    }
  }
LAB_00125f2b:
  (response->responseHeader).serviceResult = UVar2;
  return;
}

Assistant:

void Service_DeleteMonitoredItems(UA_Server *server, UA_Session *session,
                                  const UA_DeleteMonitoredItemsRequest *request,
                                  UA_DeleteMonitoredItemsResponse *response) {
    UA_LOG_DEBUG_SESSION(server->config.logger, session,
                         "Processing DeleteMonitoredItemsRequest");

    if(request->monitoredItemIdsSize == 0) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOTHINGTODO;
        return;
    }

    /* Get the subscription */
    UA_Subscription *sub = UA_Session_getSubscriptionByID(session, request->subscriptionId);
    if(!sub) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADSUBSCRIPTIONIDINVALID;
        return;
    }

    /* Reset the subscription lifetime */
    sub->currentLifetimeCount = 0;
    response->results = UA_malloc(sizeof(UA_StatusCode) * request->monitoredItemIdsSize);
    if(!response->results) {
        response->responseHeader.serviceResult = UA_STATUSCODE_BADOUTOFMEMORY;
        return;
    }
    response->resultsSize = request->monitoredItemIdsSize;

    for(size_t i = 0; i < request->monitoredItemIdsSize; ++i)
        response->results[i] = UA_Subscription_deleteMonitoredItem(server, sub, request->monitoredItemIds[i]);
}